

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.h
# Opt level: O3

double rapidjson::internal::StrtodFullPrecision
                 (double d,int p,char *decimals,size_t length,size_t decimalPosition,int exp)

{
  bool bVar1;
  int iVar2;
  RapidJSONException *this;
  char *decimals_00;
  long lVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  size_t length_00;
  double b;
  double result;
  BigInteger dInt;
  double local_d40;
  anon_union_8_2_f9eca910_for_Double_7 local_d38;
  BigInteger local_d30;
  
  uVar4 = (ulong)(uint)p;
  if (d < 0.0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: d >= 0.0");
    goto LAB_00153383;
  }
  if (length == 0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: length >= 1");
    goto LAB_00153383;
  }
  local_d40 = 0.0;
  if (p - 0x17U < 0xf) {
    d = d * *(double *)(Pow10(int)::e + (ulong)(p - 0x16) * 8);
    uVar4 = 0x16;
    if (d <= 9007199254740991.0) {
LAB_00153109:
      return d * *(double *)(Pow10(int)::e + uVar4 * 8);
    }
  }
  else if (d <= 9007199254740991.0 && p + 0x16U < 0x2d) {
    if (p < 0) {
      return d / *(double *)(Pow10(int)::e + (ulong)(uint)-p * 8);
    }
    goto LAB_00153109;
  }
  if (length >> 0x1f != 0) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: length <= INT_MAX");
    goto LAB_00153383;
  }
  if (length < decimalPosition) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: length >= decimalPosition");
    goto LAB_00153383;
  }
  if (0x7fffffff < length - decimalPosition) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: length - decimalPosition <= INT_MAX");
    goto LAB_00153383;
  }
  uVar6 = (uint)(length - decimalPosition);
  if (exp < (int)(uVar6 | 0x80000000)) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: exp >= INT_MIN + dExpAdjust");
    goto LAB_00153383;
  }
  iVar2 = exp - uVar6;
  if ((int)((uint)length ^ 0x7fffffff) < iVar2) {
    this = (RapidJSONException *)__cxa_allocate_exception(0x10);
    cereal::RapidJSONException::RapidJSONException
              (this,"rapidjson internal assertion failure: dExp <= INT_MAX - dLen");
    goto LAB_00153383;
  }
  uVar4 = (length & 0xffffffff) + 1;
  iVar5 = exp + (int)decimalPosition;
  decimals_00 = decimals;
  do {
    if (*decimals_00 != '0') {
      uVar6 = (int)uVar4 - 1;
      lVar3 = 0;
      goto LAB_00153199;
    }
    decimals_00 = decimals_00 + 1;
    uVar4 = uVar4 - 1;
    iVar5 = iVar5 + -1;
  } while (1 < (int)uVar4);
  uVar6 = 0;
  iVar5 = iVar2;
  goto LAB_001531b1;
  while( true ) {
    uVar6 = uVar6 - 1;
    uVar4 = uVar4 - 1;
    lVar3 = lVar3 + -1;
    if (uVar4 < 2) break;
LAB_00153199:
    if (decimals[lVar3 + ((length & 0xffffffff) - 1)] != '0') {
      iVar5 = iVar2 - (int)lVar3;
      goto LAB_001531c1;
    }
  }
LAB_001531b1:
  if (uVar6 == 0) {
    b = 0.0;
  }
  else {
LAB_001531c1:
    length_00 = 0x300;
    if ((int)uVar6 < 0x300) {
      length_00 = (size_t)uVar6;
    }
    iVar2 = 0;
    if (0x300 < (int)uVar6) {
      iVar2 = uVar6 - 0x300;
    }
    iVar2 = iVar2 + iVar5;
    iVar5 = iVar2 + (int)length_00;
    b = 0.0;
    if (-0x144 < iVar5) {
      if (iVar5 < 0x136) {
        bVar1 = StrtodDiyFp(decimals_00,(int)length_00,iVar2,&local_d40);
        b = local_d40;
        if (!bVar1) {
          if ((int)uVar6 < 0) {
            this = (RapidJSONException *)__cxa_allocate_exception(0x10);
            cereal::RapidJSONException::RapidJSONException
                      (this,"rapidjson internal assertion failure: dLen >= 0");
LAB_00153383:
            __cxa_throw(this,&cereal::RapidJSONException::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          BigInteger::BigInteger(&local_d30,decimals_00,length_00);
          local_d38.d_ = b;
          iVar2 = CheckWithinHalfULP(b,&local_d30,iVar2);
          if ((-1 < iVar2) && ((((ulong)b & 1) != 0 || (iVar2 != 0)))) {
            b = Double::NextPositiveDouble((Double *)&local_d38);
          }
        }
      }
      else {
        b = INFINITY;
      }
    }
  }
  return b;
}

Assistant:

inline double StrtodFullPrecision(double d, int p, const char* decimals, size_t length, size_t decimalPosition, int exp) {
    CEREAL_RAPIDJSON_ASSERT(d >= 0.0);
    CEREAL_RAPIDJSON_ASSERT(length >= 1);

    double result = 0.0;
    if (StrtodFast(d, p, &result))
        return result;

    CEREAL_RAPIDJSON_ASSERT(length <= INT_MAX);
    int dLen = static_cast<int>(length);

    CEREAL_RAPIDJSON_ASSERT(length >= decimalPosition);
    CEREAL_RAPIDJSON_ASSERT(length - decimalPosition <= INT_MAX);
    int dExpAdjust = static_cast<int>(length - decimalPosition);

    CEREAL_RAPIDJSON_ASSERT(exp >= INT_MIN + dExpAdjust);
    int dExp = exp - dExpAdjust;

    // Make sure length+dExp does not overflow
    CEREAL_RAPIDJSON_ASSERT(dExp <= INT_MAX - dLen);

    // Trim leading zeros
    while (dLen > 0 && *decimals == '0') {
        dLen--;
        decimals++;
    }

    // Trim trailing zeros
    while (dLen > 0 && decimals[dLen - 1] == '0') {
        dLen--;
        dExp++;
    }

    if (dLen == 0) { // Buffer only contains zeros.
        return 0.0;
    }

    // Trim right-most digits
    const int kMaxDecimalDigit = 767 + 1;
    if (dLen > kMaxDecimalDigit) {
        dExp += dLen - kMaxDecimalDigit;
        dLen = kMaxDecimalDigit;
    }

    // If too small, underflow to zero.
    // Any x <= 10^-324 is interpreted as zero.
    if (dLen + dExp <= -324)
        return 0.0;

    // If too large, overflow to infinity.
    // Any x >= 10^309 is interpreted as +infinity.
    if (dLen + dExp > 309)
        return std::numeric_limits<double>::infinity();

    if (StrtodDiyFp(decimals, dLen, dExp, &result))
        return result;

    // Use approximation from StrtodDiyFp and make adjustment with BigInteger comparison
    return StrtodBigInteger(result, decimals, dLen, dExp);
}